

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O2

void pcap_cleanup_linux(pcap_t *handle)

{
  void *pvVar1;
  undefined8 uVar2;
  FILE *pFVar3;
  undefined2 uVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  undefined2 uVar9;
  ifreq ifr;
  iwreq ireq;
  
  pvVar1 = handle->priv;
  if (*(uint *)((long)pvVar1 + 0x30) == 0) goto LAB_00118326;
  if ((*(uint *)((long)pvVar1 + 0x30) & 1) != 0) {
    ifr.ifr_ifru.ifru_map.mem_start = 0;
    ifr.ifr_ifru.ifru_map.mem_end = 0;
    ifr.ifr_ifrn._0_8_ = 0;
    ifr.ifr_ifrn._8_8_ = 0;
    ifr.ifr_ifru._16_8_ = 0;
    strncpy((char *)&ifr,*(char **)((long)pvVar1 + 0x20),0x10);
    ifr.ifr_ifrn._8_8_ = ifr.ifr_ifrn._8_8_ & 0xffffffffffffff;
    iVar5 = ioctl(handle->fd,0x8913,&ifr);
    if (iVar5 == -1) {
      pcVar7 = 
      "Can\'t restore interface %s flags (SIOCGIFFLAGS failed: %s).\nPlease adjust manually.\nHint: This can\'t happen with Linux >= 2.2.0.\n"
      ;
LAB_001183df:
      pFVar3 = _stderr;
      uVar2 = *(undefined8 *)((long)pvVar1 + 0x20);
      piVar6 = __errno_location();
      pcVar8 = strerror(*piVar6);
      fprintf(pFVar3,pcVar7,uVar2,pcVar8);
    }
    else if ((ifr.ifr_ifru.ifru_settings.type >> 8 & 1) != 0) {
      ifr.ifr_ifru.ifru_map.mem_start = ifr.ifr_ifru.ifru_map.mem_start & 0xfffffffffffffeff;
      iVar5 = ioctl(handle->fd,0x8914);
      if (iVar5 == -1) {
        pcVar7 = 
        "Can\'t restore interface %s flags (SIOCSIFFLAGS failed: %s).\nPlease adjust manually.\nHint: This can\'t happen with Linux >= 2.2.0.\n"
        ;
        goto LAB_001183df;
      }
    }
  }
  if ((*(byte *)((long)pvVar1 + 0x30) & 2) != 0) {
    ifr.ifr_ifru.ifru_map.mem_start = 0;
    ifr.ifr_ifru.ifru_map.mem_end = 0;
    ifr.ifr_ifrn._0_8_ = 0;
    ifr.ifr_ifrn._8_8_ = 0;
    ifr.ifr_ifru._16_8_ = 0;
    strncpy((char *)&ifr,*(char **)((long)pvVar1 + 0x20),0x10);
    ifr.ifr_ifrn._8_8_ = ifr.ifr_ifrn._8_8_ & 0xffffffffffffff;
    iVar5 = ioctl(handle->fd,0x8913,&ifr);
    uVar9 = 0;
    if ((iVar5 != -1) &&
       (uVar4 = ifr.ifr_ifru.ifru_addr.sa_family, uVar9 = 0,
       (ifr.ifr_ifru.ifru_map.mem_start & 1) != 0)) {
      ifr.ifr_ifru.ifru_map.mem_start = ifr.ifr_ifru.ifru_map.mem_start & 0xfffffffffffffffe;
      iVar5 = ioctl(handle->fd,0x8914);
      uVar9 = uVar4;
      if (iVar5 == -1) {
        uVar9 = 0;
      }
    }
    strncpy((char *)&ireq,*(char **)((long)pvVar1 + 0x20),0x10);
    ireq.ifr_ifrn.ifrn_name[0xf] = '\0';
    ireq.u.nwid.value = *(__s32 *)((long)pvVar1 + 0x48);
    iVar5 = ioctl(handle->fd,0x8b06,&ireq);
    pFVar3 = _stderr;
    if (iVar5 == -1) {
      uVar2 = *(undefined8 *)((long)pvVar1 + 0x20);
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(pFVar3,
              "Can\'t restore interface %s wireless mode (SIOCSIWMODE failed: %s).\nPlease adjust manually.\n"
              ,uVar2,pcVar7);
    }
    if (uVar9 != 0) {
      ifr.ifr_ifru.ifru_addr.sa_family = uVar9;
      iVar5 = ioctl(handle->fd,0x8914);
      pFVar3 = _stderr;
      if (iVar5 == -1) {
        uVar2 = *(undefined8 *)((long)pvVar1 + 0x20);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        fprintf(pFVar3,
                "Can\'t bring interface %s back up (SIOCSIFFLAGS failed: %s).\nPlease adjust manually.\n"
                ,uVar2,pcVar7);
      }
    }
  }
  pcap_remove_from_pcaps_to_close(handle);
LAB_00118326:
  if (*(void **)((long)pvVar1 + 0x50) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x50));
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
  }
  if (*(void **)((long)pvVar1 + 0x20) != (void *)0x0) {
    free(*(void **)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  pcap_cleanup_live_common(handle);
  return;
}

Assistant:

static void	pcap_cleanup_linux( pcap_t *handle )
{
	struct pcap_linux *handlep = handle->priv;
	struct ifreq	ifr;
#ifdef HAVE_LIBNL
	struct nl80211_state nlstate;
	int ret;
#endif /* HAVE_LIBNL */
#ifdef IW_MODE_MONITOR
	int oldflags;
	struct iwreq ireq;
#endif /* IW_MODE_MONITOR */

	if (handlep->must_do_on_close != 0) {
		/*
		 * There's something we have to do when closing this
		 * pcap_t.
		 */
		if (handlep->must_do_on_close & MUST_CLEAR_PROMISC) {
			/*
			 * We put the interface into promiscuous mode;
			 * take it out of promiscuous mode.
			 *
			 * XXX - if somebody else wants it in promiscuous
			 * mode, this code cannot know that, so it'll take
			 * it out of promiscuous mode.  That's not fixable
			 * in 2.0[.x] kernels.
			 */
			memset(&ifr, 0, sizeof(ifr));
			strlcpy(ifr.ifr_name, handlep->device,
			    sizeof(ifr.ifr_name));
			if (ioctl(handle->fd, SIOCGIFFLAGS, &ifr) == -1) {
				fprintf(stderr,
				    "Can't restore interface %s flags (SIOCGIFFLAGS failed: %s).\n"
				    "Please adjust manually.\n"
				    "Hint: This can't happen with Linux >= 2.2.0.\n",
				    handlep->device, strerror(errno));
			} else {
				if (ifr.ifr_flags & IFF_PROMISC) {
					/*
					 * Promiscuous mode is currently on;
					 * turn it off.
					 */
					ifr.ifr_flags &= ~IFF_PROMISC;
					if (ioctl(handle->fd, SIOCSIFFLAGS,
					    &ifr) == -1) {
						fprintf(stderr,
						    "Can't restore interface %s flags (SIOCSIFFLAGS failed: %s).\n"
						    "Please adjust manually.\n"
						    "Hint: This can't happen with Linux >= 2.2.0.\n",
						    handlep->device,
						    strerror(errno));
					}
				}
			}
		}

#ifdef HAVE_LIBNL
		if (handlep->must_do_on_close & MUST_DELETE_MONIF) {
			ret = nl80211_init(handle, &nlstate, handlep->device);
			if (ret >= 0) {
				ret = del_mon_if(handle, handle->fd, &nlstate,
				    handlep->device, handlep->mondevice);
				nl80211_cleanup(&nlstate);
			}
			if (ret < 0) {
				fprintf(stderr,
				    "Can't delete monitor interface %s (%s).\n"
				    "Please delete manually.\n",
				    handlep->mondevice, handle->errbuf);
			}
		}
#endif /* HAVE_LIBNL */

#ifdef IW_MODE_MONITOR
		if (handlep->must_do_on_close & MUST_CLEAR_RFMON) {
			/*
			 * We put the interface into rfmon mode;
			 * take it out of rfmon mode.
			 *
			 * XXX - if somebody else wants it in rfmon
			 * mode, this code cannot know that, so it'll take
			 * it out of rfmon mode.
			 */

			/*
			 * First, take the interface down if it's up;
			 * otherwise, we might get EBUSY.
			 * If we get errors, just drive on and print
			 * a warning if we can't restore the mode.
			 */
			oldflags = 0;
			memset(&ifr, 0, sizeof(ifr));
			strlcpy(ifr.ifr_name, handlep->device,
			    sizeof(ifr.ifr_name));
			if (ioctl(handle->fd, SIOCGIFFLAGS, &ifr) != -1) {
				if (ifr.ifr_flags & IFF_UP) {
					oldflags = ifr.ifr_flags;
					ifr.ifr_flags &= ~IFF_UP;
					if (ioctl(handle->fd, SIOCSIFFLAGS, &ifr) == -1)
						oldflags = 0;	/* didn't set, don't restore */
				}
			}

			/*
			 * Now restore the mode.
			 */
			strlcpy(ireq.ifr_ifrn.ifrn_name, handlep->device,
			    sizeof ireq.ifr_ifrn.ifrn_name);
			ireq.u.mode = handlep->oldmode;
			if (ioctl(handle->fd, SIOCSIWMODE, &ireq) == -1) {
				/*
				 * Scientist, you've failed.
				 */
				fprintf(stderr,
				    "Can't restore interface %s wireless mode (SIOCSIWMODE failed: %s).\n"
				    "Please adjust manually.\n",
				    handlep->device, strerror(errno));
			}

			/*
			 * Now bring the interface back up if we brought
			 * it down.
			 */
			if (oldflags != 0) {
				ifr.ifr_flags = oldflags;
				if (ioctl(handle->fd, SIOCSIFFLAGS, &ifr) == -1) {
					fprintf(stderr,
					    "Can't bring interface %s back up (SIOCSIFFLAGS failed: %s).\n"
					    "Please adjust manually.\n",
					    handlep->device, strerror(errno));
				}
			}
		}
#endif /* IW_MODE_MONITOR */

		/*
		 * Take this pcap out of the list of pcaps for which we
		 * have to take the interface out of some mode.
		 */
		pcap_remove_from_pcaps_to_close(handle);
	}

	if (handlep->mondevice != NULL) {
		free(handlep->mondevice);
		handlep->mondevice = NULL;
	}
	if (handlep->device != NULL) {
		free(handlep->device);
		handlep->device = NULL;
	}
	pcap_cleanup_live_common(handle);
}